

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

bool __thiscall
QTreeWidget::dropMimeData
          (QTreeWidget *this,QTreeWidgetItem *parent,int index,QMimeData *data,DropAction action)

{
  undefined1 uVar1;
  char *__s;
  QAbstractItemModel *pQVar2;
  long in_FS_OFFSET;
  QAbstractItemModel local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  QTreeWidgetItem *local_38;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  local_48 = (QAbstractItemModel)0xff;
  uStack_47 = 0xffffffffffffff;
  uStack_40 = 0;
  local_38 = (QTreeWidgetItem *)0x0;
  if (parent != (QTreeWidgetItem *)0x0) {
    __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
    QTreeModel::index((QTreeModel *)&stack0xffffffffffffffb8,__s,(int)parent);
  }
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)this);
  uVar1 = QAbstractItemModel::dropMimeData
                    ((QMimeData *)pQVar2,(DropAction)data,action,index,(QModelIndex *)0x0);
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeWidget::dropMimeData(QTreeWidgetItem *parent, int index,
                               const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
    if (parent) idx = indexFromItem(parent);
    return model()->QAbstractItemModel::dropMimeData(data, action , index, 0, idx);
}